

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::C_FindObjectsInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount)

{
  SessionObjectStore *this_00;
  unsigned_long uVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  Session *this_01;
  Slot *this_02;
  CK_STATE CVar5;
  Token *this_03;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_04;
  CK_SLOT_ID CVar6;
  unsigned_long uVar7;
  ByteString *pBVar8;
  size_t sVar9;
  _Base_ptr p_Var10;
  size_t *outlen;
  char *in_R8;
  size_t *psVar11;
  size_t in_R9;
  unsigned_long *puVar12;
  CK_ULONG CVar13;
  bool bVar14;
  bool bVar15;
  CK_RV CStack_1e0;
  ByteString bsAttrValue;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> allObjects;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> handles;
  ByteString bsTemplateValue;
  OSAttribute attr;
  
  CStack_1e0 = 400;
  if (this->isInitialised == true) {
    outlen = (size_t *)CONCAT71((int7)(ulCount >> 8),ulCount != 0);
    if (pTemplate == (CK_ATTRIBUTE_PTR)0x0 && ulCount != 0) {
      CStack_1e0 = 7;
    }
    else {
      this_01 = (Session *)HandleManager::getSession(this->handleManager,hSession);
      if (this_01 == (Session *)0x0) {
        CStack_1e0 = 0xb3;
      }
      else {
        this_02 = Session::getSlot(this_01);
        CStack_1e0 = 5;
        if (this_02 != (Slot *)0x0) {
          CVar5 = Session::getState(this_01);
          this_03 = Session::getToken(this_01);
          if (this_03 != (Token *)0x0) {
            iVar4 = Session::getOpType(this_01);
            CStack_1e0 = 0x90;
            if (iVar4 == 0) {
              Session::setOpType(this_01,1);
              this_04 = (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)FindOperation::create();
              if (this_04 ==
                  (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)0x0) {
                CStack_1e0 = 2;
              }
              else {
                allObjects._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &allObjects._M_t._M_impl.super__Rb_tree_header._M_header;
                allObjects._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                allObjects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                allObjects._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                allObjects._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     allObjects._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                Token::getObjects(this_03,&allObjects);
                this_00 = this->sessionObjectStore;
                CVar6 = Slot::getSlotID(this_02);
                SessionObjectStore::getObjects(this_00,CVar6,&allObjects);
                handles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &handles._M_t._M_impl.super__Rb_tree_header._M_header;
                handles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                handles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                handles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                handles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     handles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                for (p_Var10 = allObjects._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    (_Rb_tree_header *)p_Var10 != &allObjects._M_t._M_impl.super__Rb_tree_header;
                    p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
                  cVar2 = (**(code **)(**(long **)(p_Var10 + 1) + 0x50))();
                  if (cVar2 == '\0') {
                    outlen = (size_t *)0x7bf;
                    in_R8 = "Object is not valid, skipping";
                    softHSMLog(7,"C_FindObjectsInit",
                               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                               ,0x7bf,"Object is not valid, skipping");
                  }
                  else {
                    bVar3 = (**(code **)(**(long **)(p_Var10 + 1) + 0x20))
                                      (*(long **)(p_Var10 + 1),2,1);
                    bVar15 = (CVar5 - 1 & 0xfffffffffffffffd) != 0;
                    outlen = (size_t *)CONCAT71((int7)((ulong)outlen >> 8),bVar15);
                    if ((bVar15 & bVar3) == 0) {
                      bVar15 = true;
                      puVar12 = &pTemplate->ulValueLen;
                      CVar13 = ulCount;
                      while (bVar14 = CVar13 != 0, CVar13 = CVar13 - 1, bVar14) {
                        cVar2 = (**(code **)(**(long **)(p_Var10 + 1) + 0x10))
                                          (*(long **)(p_Var10 + 1),
                                           ((_CK_ATTRIBUTE *)(puVar12 + -2))->type);
                        if (cVar2 == '\0') goto LAB_00130bc2;
                        (**(code **)(**(long **)(p_Var10 + 1) + 0x18))
                                  (&attr,*(long **)(p_Var10 + 1),
                                   ((_CK_ATTRIBUTE *)(puVar12 + -2))->type);
                        bVar15 = OSAttribute::isBooleanAttribute(&attr);
                        if (!bVar15) {
                          bVar15 = OSAttribute::isUnsignedLongAttribute(&attr);
                          if (bVar15) {
                            if ((*puVar12 == 8) &&
                               (uVar1 = *(unsigned_long *)puVar12[-1],
                               uVar7 = OSAttribute::getUnsignedLongValue(&attr), uVar7 == uVar1))
                            goto LAB_00130b77;
                          }
                          else {
                            bVar15 = OSAttribute::isByteStringAttribute(&attr);
                            if (bVar15) {
                              ByteString::ByteString(&bsAttrValue);
                              if (bVar3 == 0) {
LAB_00130afb:
                                pBVar8 = OSAttribute::getByteStringValue(&attr);
                                ByteString::operator=(&bsAttrValue,pBVar8);
LAB_00130b10:
                                sVar9 = ByteString::size(&bsAttrValue);
                                if (sVar9 != *puVar12) {
LAB_00130b56:
                                  iVar4 = 6;
                                  goto LAB_00130b5b;
                                }
                                if (sVar9 != 0) {
                                  ByteString::ByteString
                                            (&bsTemplateValue,(uchar *)puVar12[-1],sVar9);
                                  bVar15 = ByteString::operator!=(&bsAttrValue,&bsTemplateValue);
                                  ByteString::~ByteString(&bsTemplateValue);
                                  if (bVar15) goto LAB_00130b56;
                                }
                                iVar4 = 0;
                                bVar15 = true;
                              }
                              else {
                                pBVar8 = OSAttribute::getByteStringValue(&attr);
                                sVar9 = ByteString::size(pBVar8);
                                if (sVar9 == 0) goto LAB_00130afb;
                                pBVar8 = OSAttribute::getByteStringValue(&attr);
                                iVar4 = Token::decrypt(this_03,(EVP_PKEY_CTX *)pBVar8,
                                                       (uchar *)&bsAttrValue,outlen,(uchar *)in_R8,
                                                       in_R9);
                                if ((char)iVar4 != '\0') goto LAB_00130b10;
                                std::
                                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                ::~_Rb_tree(this_04);
                                operator_delete(this_04);
                                iVar4 = 1;
LAB_00130b5b:
                                bVar15 = false;
                              }
                              ByteString::~ByteString(&bsAttrValue);
                              if (bVar15) goto LAB_00130b77;
                              OSAttribute::~OSAttribute(&attr);
                              if (iVar4 == 0) {
                                bVar15 = false;
                                goto LAB_00130b81;
                              }
                              if (1 < iVar4 - 5U) goto LAB_00130cdd;
                              goto LAB_00130bc2;
                            }
                          }
LAB_00130bd2:
                          OSAttribute::~OSAttribute(&attr);
                          goto LAB_00130bc2;
                        }
                        if (*puVar12 != 1) goto LAB_00130bd2;
                        cVar2 = *(char *)puVar12[-1];
                        bVar15 = OSAttribute::getBooleanValue(&attr);
                        outlen = (size_t *)CONCAT71((int7)((ulong)outlen >> 8),cVar2 != '\x01');
                        if (bVar15 == (cVar2 != '\x01')) goto LAB_00130bd2;
LAB_00130b77:
                        OSAttribute::~OSAttribute(&attr);
                        bVar15 = true;
LAB_00130b81:
                        puVar12 = puVar12 + 3;
                      }
                      if (bVar15) {
                        CVar6 = Slot::getSlotID(this_02);
                        cVar2 = (**(code **)(**(long **)(p_Var10 + 1) + 0x20))
                                          (*(long **)(p_Var10 + 1),1,0);
                        bVar15 = (bool)(**(code **)(**(long **)(p_Var10 + 1) + 0x20))
                                                 (*(long **)(p_Var10 + 1),2,1);
                        in_R8 = *(char **)(p_Var10 + 1);
                        outlen = (size_t *)0x0;
                        if (cVar2 == '\0') {
                          attr._vptr_OSAttribute =
                               (_func_int **)
                               HandleManager::addSessionObject
                                         (this->handleManager,CVar6,hSession,bVar15,in_R8);
                        }
                        else {
                          psVar11 = (size_t *)in_R8;
                          attr._vptr_OSAttribute =
                               (_func_int **)
                               HandleManager::addTokenObject(this->handleManager,CVar6,bVar15,in_R8)
                          ;
                          outlen = (size_t *)in_R8;
                          in_R8 = (char *)psVar11;
                        }
                        if (attr._vptr_OSAttribute == (_func_int **)0x0) {
                          std::
                          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          ::~_Rb_tree(this_04);
                          operator_delete(this_04);
LAB_00130cdd:
                          CStack_1e0 = 5;
                          goto LAB_00130caa;
                        }
                        std::
                        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        ::_M_insert_unique<unsigned_long_const&>
                                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                    *)&handles,(unsigned_long *)&attr);
                      }
                    }
                  }
LAB_00130bc2:
                }
                FindOperation::setHandles((FindOperation *)this_04,&handles);
                Session::setFindOp(this_01,(FindOperation *)this_04);
                CStack_1e0 = 0;
LAB_00130caa:
                std::
                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                ::~_Rb_tree(&handles._M_t);
                std::
                _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
                ::~_Rb_tree(&allObjects._M_t);
              }
            }
          }
        }
      }
    }
  }
  return CStack_1e0;
}

Assistant:

CK_RV SoftHSM::C_FindObjectsInit(CK_SESSION_HANDLE hSession, CK_ATTRIBUTE_PTR pTemplate, CK_ULONG ulCount)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;
	if (pTemplate == NULL_PTR && ulCount != 0) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the slot
	Slot* slot = session->getSlot();
	if (slot == NULL_PTR) return CKR_GENERAL_ERROR;

	// Determine whether we have a public session or not.
	bool isPublicSession;
	switch (session->getState()) {
		case CKS_RO_USER_FUNCTIONS:
		case CKS_RW_USER_FUNCTIONS:
			isPublicSession = false;
			break;
		default:
			isPublicSession = true;
	}

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	session->setOpType(SESSION_OP_FIND);
	FindOperation *findOp = FindOperation::create();

	// Check if we are out of memory
	if (findOp == NULL_PTR) return CKR_HOST_MEMORY;

	std::set<OSObject*> allObjects;
	token->getObjects(allObjects);
	sessionObjectStore->getObjects(slot->getSlotID(),allObjects);

	std::set<CK_OBJECT_HANDLE> handles;
	std::set<OSObject*>::iterator it;
	for (it=allObjects.begin(); it != allObjects.end(); ++it)
	{
		// Refresh object and check if it is valid
		if (!(*it)->isValid()) {
			DEBUG_MSG("Object is not valid, skipping");
			continue;
		}

		// Determine if the object has CKA_PRIVATE set to CK_TRUE
		bool isPrivateObject = (*it)->getBooleanValue(CKA_PRIVATE, true);

		// If the object is private, and we are in a public session then skip it !
		if (isPublicSession && isPrivateObject)
			continue; // skip object

		// Perform the actual attribute matching.
		bool bAttrMatch = true; // We let an empty template match everything.
		for (CK_ULONG i=0; i<ulCount; ++i)
		{
			bAttrMatch = false;

			if (!(*it)->attributeExists(pTemplate[i].type))
				break;

			OSAttribute attr = (*it)->getAttribute(pTemplate[i].type);

			if (attr.isBooleanAttribute())
			{
				if (sizeof(CK_BBOOL) != pTemplate[i].ulValueLen)
					break;
				bool bTemplateValue = (*(CK_BBOOL*)pTemplate[i].pValue == CK_TRUE);
				if (attr.getBooleanValue() != bTemplateValue)
					break;
			}
			else
			{
				if (attr.isUnsignedLongAttribute())
				{
					if (sizeof(CK_ULONG) != pTemplate[i].ulValueLen)
						break;
					CK_ULONG ulTemplateValue = *(CK_ULONG_PTR)pTemplate[i].pValue;
					if (attr.getUnsignedLongValue() != ulTemplateValue)
						break;
				}
				else
				{
					if (attr.isByteStringAttribute())
					{
						ByteString bsAttrValue;
						if (isPrivateObject && attr.getByteStringValue().size() != 0)
						{
							if (!token->decrypt(attr.getByteStringValue(), bsAttrValue))
							{
								delete findOp;
								return CKR_GENERAL_ERROR;
							}
						}
						else
							bsAttrValue = attr.getByteStringValue();

						if (bsAttrValue.size() != pTemplate[i].ulValueLen)
							break;
						if (pTemplate[i].ulValueLen != 0)
						{
							ByteString bsTemplateValue((const unsigned char*)pTemplate[i].pValue, pTemplate[i].ulValueLen);
							if (bsAttrValue != bsTemplateValue)
								break;
						}
					}
					else
						break;
				}
			}
			// The attribute matched !
			bAttrMatch = true;
		}

		if (bAttrMatch)
		{
			CK_SLOT_ID slotID = slot->getSlotID();
			bool isOnToken = (*it)->getBooleanValue(CKA_TOKEN, false);
			bool isPrivate = (*it)->getBooleanValue(CKA_PRIVATE, true);
			// Create an object handle for every returned object.
			CK_OBJECT_HANDLE hObject;
			if (isOnToken)
				hObject = handleManager->addTokenObject(slotID,isPrivate,*it);
			else
				hObject = handleManager->addSessionObject(slotID,hSession,isPrivate,*it);
			if (hObject == CK_INVALID_HANDLE)
			{
				delete findOp;
				return CKR_GENERAL_ERROR;
			}
			handles.insert(hObject);
		}
	}

	// Storing the object handles for the find will protect the library
	// whenever a stale object handle is used to access the library.
	findOp->setHandles(handles);

	session->setFindOp(findOp);

	return CKR_OK;
}